

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::UpdateTryMergeWindowIntoHostViewport(ImGuiWindow *window,ImGuiViewportP *viewport)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiViewportP *pIVar3;
  ImGuiWindow *pIVar4;
  ImGuiViewportP *pIVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ushort uVar8;
  ImGuiContext *pIVar9;
  bool bVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  pIVar9 = GImGui;
  pIVar3 = window->Viewport;
  if ((pIVar3 != viewport) && (((viewport->super_ImGuiViewport).Flags & 0x280U) == 0x200)) {
    fVar19 = (window->Pos).x;
    fVar20 = (window->Pos).y;
    IVar1 = (viewport->super_ImGuiViewport).Pos;
    fVar17 = IVar1.x;
    if (fVar19 < fVar17) {
      return false;
    }
    fVar18 = IVar1.y;
    uVar8 = -(ushort)(fVar18 <= fVar20);
    if ((uVar8 & 1) == 0) {
      return false;
    }
    IVar1 = (viewport->super_ImGuiViewport).Size;
    fVar21 = (window->Size).x + fVar19;
    fVar22 = (window->Size).y + fVar20;
    iVar14 = -(uint)(fVar21 <= fVar17 + IVar1.x);
    iVar15 = -(uint)(fVar22 <= fVar18 + IVar1.y);
    auVar6._4_4_ = iVar14;
    auVar6._0_4_ = iVar14;
    auVar6._8_4_ = iVar15;
    auVar6._12_4_ = iVar15;
    uVar12 = movmskpd((uint)uVar8,auVar6);
    if ((uVar12 & 1) == 0) {
      return false;
    }
    if ((byte)((byte)uVar12 >> 1) == 0) {
      return false;
    }
    bVar10 = GetWindowAlwaysWantOwnViewport(window);
    if (!bVar10) {
      iVar14 = (pIVar9->Windows).Size;
      lVar11 = (long)iVar14;
      if (0 < lVar11) {
        lVar13 = 0;
        do {
          pIVar4 = (pIVar9->Windows).Data[lVar13];
          if (pIVar4 == window) break;
          if (((pIVar4->WasActive == true) && (pIVar4->ViewportOwned == true)) &&
             ((pIVar4->Flags & 0x1000000) == 0)) {
            pIVar5 = pIVar4->Viewport;
            IVar1 = (pIVar5->super_ImGuiViewport).Pos;
            IVar2 = (pIVar5->super_ImGuiViewport).Size;
            fVar17 = IVar1.x;
            fVar18 = IVar1.y;
            iVar15 = -(uint)(fVar19 < IVar2.x + fVar17);
            iVar16 = -(uint)(fVar20 < IVar2.y + fVar18);
            auVar7._4_4_ = iVar15;
            auVar7._0_4_ = iVar15;
            auVar7._8_4_ = iVar16;
            auVar7._12_4_ = iVar16;
            uVar12 = movmskpd((int)pIVar5,auVar7);
            if ((((uVar12 & 2) != 0) && (fVar18 < fVar22)) &&
               (((uVar12 & 1) != 0 && (fVar17 < fVar21)))) {
              return false;
            }
          }
          lVar13 = lVar13 + 1;
        } while (lVar11 != lVar13);
        if ((0 < iVar14) && (window->ViewportOwned != false)) {
          lVar13 = 0;
          do {
            if ((pIVar9->Windows).Size <= lVar13) {
              __assert_fail("i >= 0 && i < Size",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                            ,0x5c2,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]"
                           );
            }
            pIVar4 = (pIVar9->Windows).Data[lVar13];
            if (pIVar4->Viewport == pIVar3) {
              pIVar4->Viewport = viewport;
              pIVar4->ViewportId = (viewport->super_ImGuiViewport).ID;
              pIVar4->ViewportOwned = viewport->Window == pIVar4;
            }
            lVar13 = lVar13 + 1;
          } while (lVar11 != lVar13);
        }
      }
      window->Viewport = viewport;
      window->ViewportId = (viewport->super_ImGuiViewport).ID;
      window->ViewportOwned = viewport->Window == window;
      BringWindowToDisplayFront(window);
      return true;
    }
  }
  return false;
}

Assistant:

static bool ImGui::UpdateTryMergeWindowIntoHostViewport(ImGuiWindow* window, ImGuiViewportP* viewport)
{
    ImGuiContext& g = *GImGui;
    if (window->Viewport == viewport)
        return false;
    if ((viewport->Flags & ImGuiViewportFlags_CanHostOtherWindows) == 0)
        return false;
    if ((viewport->Flags & ImGuiViewportFlags_Minimized) != 0)
        return false;
    if (!viewport->GetMainRect().Contains(window->Rect()))
        return false;
    if (GetWindowAlwaysWantOwnViewport(window))
        return false;

    for (int n = 0; n < g.Windows.Size; n++)
    {
        ImGuiWindow* window_behind = g.Windows[n];
        if (window_behind == window)
            break;
        if (window_behind->WasActive && window_behind->ViewportOwned && !(window_behind->Flags & ImGuiWindowFlags_ChildWindow))
            if (window_behind->Viewport->GetMainRect().Overlaps(window->Rect()))
                return false;
    }

    // Move to the existing viewport, Move child/hosted windows as well (FIXME-OPT: iterate child)
    ImGuiViewportP* old_viewport = window->Viewport;
    if (window->ViewportOwned)
        for (int n = 0; n < g.Windows.Size; n++)
            if (g.Windows[n]->Viewport == old_viewport)
                SetWindowViewport(g.Windows[n], viewport);
    SetWindowViewport(window, viewport);
    BringWindowToDisplayFront(window);

    return true;
}